

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  pointer ppVar1;
  undefined8 uVar2;
  ulong uVar3;
  pair<const_int,_int> pVar4;
  int iVar5;
  float fVar6;
  size_type kSize;
  hasher local_100;
  key_equal local_f0;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_e0;
  unsigned_long local_b8;
  undefined1 local_b0 [8];
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_a8;
  
  local_b8 = 0x400;
  *(undefined8 *)
   ((long)&(this->
           super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.settings + 0x20) = 0x3f4ccccd;
  fVar6 = (float)(this->
                 super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.num_buckets * 0.8;
  uVar3 = (ulong)fVar6;
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  *(ulong *)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.settings + 0x10) =
       (long)(fVar6 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  *(size_type *)
   ((long)&(this->
           super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.settings + 0x18) = 0;
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x28) = false;
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x396);
  this_01 = &(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_01->rep);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  *(int *)((long)&(this->
                  super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ).
                  super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.
                  super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.key_info + 0xc) = pVar4.first;
  iVar5 = 1;
  do {
    local_e0.first.super_iterator.ht =
         (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)UniqueObjectHelper<std::pair<int_const,int>>(iVar5);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)local_b0,
             &this_00->
              super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,(value_type *)&local_e0);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x334);
  local_e0.first.super_iterator.ht =
       *(dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         **)&(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.rep.num_buckets;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_b0,"kSize","this->ht_.bucket_count()",&local_b8,
             (unsigned_long *)&local_e0);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((pointer)local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                 super_Hasher._0_8_ == (pointer)0x0) {
      pVar4 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar4 = *(pair<const_int,_int> *)
               local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               super_Hasher._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5ac,(char *)pVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((pair<const_int,_int>)local_e0.first.super_iterator.ht != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_e0.first.super_iterator.ht + 8))();
    }
  }
  uVar2 = local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
          _0_8_;
  if ((pointer)local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               super_Hasher._0_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)
         local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
         _0_8_ != (pair<const_int,_int>)
                  (local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                   super_Hasher._0_8_ + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)
                               local_a8.settings.
                               super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                               super_Hasher._0_8_);
    }
    operator_delete((void *)uVar2);
  }
  iVar5 = 0x400;
  do {
    pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x332);
    local_b0._0_4_ = pVar4.first;
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::erase(&this_01->rep,(key_type *)local_b0);
    local_e0.first.super_iterator.ht =
         (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)UniqueObjectHelper<std::pair<int_const,int>>(0x332);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)local_b0,
             &this_00->
              super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,(value_type *)&local_e0);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  local_e0.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_e0.first.super_iterator.ht & 0xffffffff00000000);
  local_100.id_ = 2;
  testing::internal::CmpHelperLT<int,int>
            ((internal *)local_b0,"this->ht_.num_table_copies()","pre_copies + 2",(int *)&local_e0,
             (int *)&local_100);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((pointer)local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                 super_Hasher._0_8_ == (pointer)0x0) {
      pVar4 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar4 = *(pair<const_int,_int> *)
               local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               super_Hasher._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5b5,(char *)pVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (local_e0.first.super_iterator.ht !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_e0.first.super_iterator.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  if ((pointer)local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               super_Hasher._0_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)
         local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
         _0_8_ != (pair<const_int,_int>)
                  (local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                   super_Hasher._0_8_ + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)
                               local_a8.settings.
                               super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                               super_Hasher._0_8_);
    }
    operator_delete((void *)local_a8.settings.
                            super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
                            _0_8_);
  }
  local_100.id_ = 0;
  local_100.num_hashes_ = 0;
  local_100.num_compares_ = 0;
  local_f0.id_ = 0;
  local_f0.num_hashes_ = 0;
  local_f0.num_compares_ = 0;
  local_e0.first.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_e0.first.super_iterator.ht & 0xffffffff00000000);
  local_e0.first.super_iterator.pos = (pointer)0x0;
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_b0,0,&local_100,&local_f0,(allocator_type *)&local_e0);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x396);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&local_a8);
  local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = true;
  local_a8.key_info.delkey = pVar4.first;
  local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_ = 0.8
  ;
  local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ = 0.0;
  uVar3 = (ulong)((float)local_a8.num_buckets * 0.8);
  local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_ =
       (long)((float)local_a8.num_buckets * 0.8 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ = 0
  ;
  local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
       false;
  local_100.id_ = (undefined4)local_a8.num_buckets;
  local_100.num_hashes_ = local_a8.num_buckets._4_4_;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            ((internal *)&local_e0,"ht2.bucket_count()","kSize",(unsigned_long *)&local_100,
             &local_b8);
  if ((char)local_e0.first.super_iterator.ht == '\0') {
    testing::Message::Message((Message *)&local_100);
    if (local_e0.first.super_iterator.pos == (pointer)0x0) {
      pVar4 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar4 = *local_e0.first.super_iterator.pos;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5be,(char *)pVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((pair<const_int,_int>)local_100._0_8_ != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_100._0_8_ + 8))();
    }
  }
  ppVar1 = local_e0.first.super_iterator.pos;
  if (local_e0.first.super_iterator.pos != (pointer)0x0) {
    if (*local_e0.first.super_iterator.pos !=
        (pair<const_int,_int>)(local_e0.first.super_iterator.pos + 2)) {
      operator_delete((void *)*local_e0.first.super_iterator.pos);
    }
    operator_delete(ppVar1);
  }
  iVar5 = 1;
  do {
    local_100._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(iVar5);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_e0,
             (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_b0,(value_type *)&local_100);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x334);
  local_100.id_ = (undefined4)local_a8.num_buckets;
  local_100.num_hashes_ = local_a8.num_buckets._4_4_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_e0,"ht2.bucket_count()","kSize",(unsigned_long *)&local_100,
             &local_b8);
  if ((char)local_e0.first.super_iterator.ht == '\0') {
    testing::Message::Message((Message *)&local_100);
    if (local_e0.first.super_iterator.pos == (pointer)0x0) {
      pVar4 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar4 = *local_e0.first.super_iterator.pos;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5c2,(char *)pVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((pair<const_int,_int>)local_100._0_8_ != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_100._0_8_ + 8))();
    }
  }
  ppVar1 = local_e0.first.super_iterator.pos;
  if (local_e0.first.super_iterator.pos != (pointer)0x0) {
    if (*local_e0.first.super_iterator.pos !=
        (pair<const_int,_int>)(local_e0.first.super_iterator.pos + 2)) {
      operator_delete((void *)*local_e0.first.super_iterator.pos);
    }
    operator_delete(ppVar1);
  }
  iVar5 = 1;
  do {
    pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(iVar5);
    local_e0.first.super_iterator.ht =
         (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)CONCAT44(local_e0.first.super_iterator.ht._4_4_,pVar4.first);
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::erase(&local_a8,(key_type *)&local_e0);
    local_100.id_ = (undefined4)local_a8.num_buckets;
    local_100.num_hashes_ = local_a8.num_buckets._4_4_;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_e0,"ht2.bucket_count()","kSize",(unsigned_long *)&local_100,
               &local_b8);
    if ((char)local_e0.first.super_iterator.ht == '\0') {
      testing::Message::Message((Message *)&local_100);
      pVar4 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
      if (local_e0.first.super_iterator.pos != (pointer)0x0) {
        pVar4 = *local_e0.first.super_iterator.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x5c5,(char *)pVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
      if ((pair<const_int,_int>)local_100._0_8_ != (pair<const_int,_int>)0x0) {
        (**(code **)(*(long *)local_100._0_8_ + 8))();
      }
    }
    ppVar1 = local_e0.first.super_iterator.pos;
    if (local_e0.first.super_iterator.pos != (pointer)0x0) {
      if (*local_e0.first.super_iterator.pos !=
          (pair<const_int,_int>)(local_e0.first.super_iterator.pos + 2)) {
        operator_delete((void *)*local_e0.first.super_iterator.pos);
      }
      operator_delete(ppVar1);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x334);
  local_100._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x334);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&local_e0,
           (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)local_b0,(value_type *)&local_100);
  local_100.id_ = (undefined4)local_a8.num_buckets;
  local_100.num_hashes_ = local_a8.num_buckets._4_4_;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)&local_e0,"ht2.bucket_count()","kSize",(unsigned_long *)&local_100,
             &local_b8);
  if ((char)local_e0.first.super_iterator.ht == '\0') {
    testing::Message::Message((Message *)&local_100);
    if (local_e0.first.super_iterator.pos == (pointer)0x0) {
      pVar4 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar4 = *local_e0.first.super_iterator.pos;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x5c8,(char *)pVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((pair<const_int,_int>)local_100._0_8_ != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_100._0_8_ + 8))();
    }
  }
  ppVar1 = local_e0.first.super_iterator.pos;
  if (local_e0.first.super_iterator.pos != (pointer)0x0) {
    if (*local_e0.first.super_iterator.pos !=
        (pair<const_int,_int>)(local_e0.first.super_iterator.pos + 2)) {
      operator_delete((void *)*local_e0.first.super_iterator.pos);
    }
    operator_delete(ppVar1);
  }
  local_b0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c16428;
  if (local_a8.table != (pointer)0x0) {
    free(local_a8.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}